

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed-message.h
# Opt level: O0

bool rtosc::
     validate<2,irqus::typestring<(char)115,(char)101,(char)110,(char)100,(char)45,(char)116,(char)111>>
               (char *arg)

{
  bool bVar1;
  undefined8 in_RDI;
  advance_size<irqus::typestring<_s_,__e_,__n_,__d_,____,__t_,__o_>_> size;
  undefined1 local_1;
  
  bVar1 = match_path<irqus::typestring<(char)115,(char)101,(char)110,(char)100,(char)45,(char)116,(char)111>>
                    (in_RDI);
  if (bVar1) {
    local_1 = validate<2>((char *)0x1027c8);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool validate(const char *arg)
{
    advance_size<This> size;
    if(size && !valid_char<This>(rtosc_type(arg,i)))
        return false;
    else if(!size && !match_path<This>(size, arg))
        return false;
    else
        return validate<i+size.value,Rest...>(arg);
}